

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryPushJavascriptArrayNoFastPath
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  code *pcVar1;
  double value;
  int iVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  uint64 uVar6;
  uint64 uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  Var pvVar10;
  Type initIndex;
  long lVar11;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  BigIndex big;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,arr);
  initIndex = (arr->super_ArrayObject).length;
  if (initIndex == 0xffffffff || argCount == 0) {
    if (argCount == 0) goto LAB_00b7827a;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar2 = (int)uVar9;
      iVar4 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x29])(arr,(ulong)(iVar2 + initIndex),args[uVar9],0);
      if (iVar4 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < argCount) && (iVar2 + initIndex != -2));
    initIndex = initIndex + (int)uVar9;
    if (argCount <= uVar9) {
LAB_00b7827a:
      (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
      if ((int)initIndex < 0) {
        value = (double)initIndex;
        uVar6 = NumberUtilities::ToSpecial(value);
        bVar3 = NumberUtilities::IsNan(value);
        if (((bVar3) && (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0xfff8000000000000)) &&
           (uVar7 = NumberUtilities::ToSpecial(value), uVar7 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) goto LAB_00b78495;
          *puVar8 = 0;
        }
        pvVar10 = (Var)(uVar6 ^ 0xfffc000000000000);
      }
      else {
        pvVar10 = (Var)((ulong)initIndex | 0x1000000000000);
      }
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return pvVar10;
    }
  }
  EnsureNonNativeArray(arr);
  if (initIndex != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x154e,"(n == JavascriptArray::MaxArrayLength)",
                                "n == JavascriptArray::MaxArrayLength");
    if (!bVar3) {
LAB_00b78495:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,initIndex);
  if ((uint)uVar9 < argCount) {
    lVar11 = 0;
    do {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar5 = BigIndex::SetItem((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,arr,
                                args[(uVar9 & 0xffffffff) + lVar11]);
      if (BVar5 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      if (jsReentLock._24_4_ != -1) {
        jsReentLock._24_4_ = jsReentLock._24_4_ + 1;
      }
      lVar11 = lVar11 + 1;
    } while (argCount - (uint)uVar9 != (int)lVar11);
  }
  (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArrayNoFastPath(ScriptContext * scriptContext, JavascriptArray* arr, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // First handle "small" indices.
        uint index;
        for (index = 0; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[index], PropertyOperation_None));
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            // Not supporting native array with BigIndex.
            arr = EnsureNonNativeArray(arr);
            Assert(n == JavascriptArray::MaxArrayLength);
            for (BigIndex big = n; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(big.SetItem(arr, args[index])));
            }

#ifdef VALIDATE_ARRAY
            arr->ValidateArray();
#endif
            // This is where we should set the length, but for arrays it cannot be >= MaxArrayLength
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
        }

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return JavascriptNumber::ToVar(n, scriptContext);
    }